

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

float __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::compute_upper_bound
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this)

{
  size_type sVar1;
  reference pvVar2;
  size_t e;
  size_t i;
  float ret;
  branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this_local;
  
  i._4_4_ = 0.0;
  e = 0;
  sVar1 = std::
          vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
          ::size(&this->items);
  for (; e != sVar1; e = e + 1) {
    pvVar2 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[](&this->items,e);
    if (pvVar2->r < 0.0) {
      pvVar2 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
               ::operator[](&this->items,e);
      i._4_4_ = pvVar2->r + i._4_4_;
    }
  }
  return i._4_4_;
}

Assistant:

Float compute_upper_bound() noexcept
    {
        Float ret = 0;

        if constexpr (std::is_same_v<Mode, minimize_tag>) {
            for (size_t i = 0, e = items.size(); i != e; ++i)
                if (items[i].r < 0)
                    ret += items[i].r;
        } else {
            for (size_t i = 0, e = items.size(); i != e; ++i)
                if (items[i].r > 0)
                    ret += items[i].r;
        }

        return ret;
    }